

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rg_etc1.cpp
# Opt level: O0

bool __thiscall crnlib::rg_etc1::etc1_optimizer::compute(etc1_optimizer *this)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint b;
  uint g;
  int iVar6;
  int iVar7;
  uint r_00;
  uint g_00;
  vec3F *this_00;
  bool bVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  uint local_c4;
  uint8 *pSelectors;
  etc1_solution_coordinates coords1;
  bool skip;
  int bb1;
  int bg1;
  int br1;
  float avg_delta_b_f;
  float avg_delta_g_f;
  float avg_delta_r_f;
  int yd_1;
  uint s;
  uint r;
  color_quad_u8 base_color;
  int delta_sum_b;
  int delta_sum_g;
  int delta_sum_r;
  int *pInten_table;
  uint8 *pSelectors_1;
  uint refinement_trial;
  uint max_refinement_trials;
  etc1_solution_coordinates coords;
  int mbr;
  int xd;
  int xdi;
  int mbg;
  int yd;
  int ydi;
  int mbb;
  int zd;
  int zdi;
  int scan_delta_size;
  uint n;
  etc1_optimizer *this_local;
  
  uVar1 = this->m_pParams->m_num_src_pixels;
  uVar2 = this->m_pParams->m_scan_delta_size;
  for (mbb = 0; mbb < (int)uVar2; mbb = mbb + 1) {
    iVar3 = this->m_pParams->m_pScan_deltas[mbb];
    b = this->m_bb + iVar3;
    if (-1 < (int)b) {
      if (this->m_limit < (int)b) break;
      for (mbg = 0; mbg < (int)uVar2; mbg = mbg + 1) {
        iVar4 = this->m_pParams->m_pScan_deltas[mbg];
        g = this->m_bg + iVar4;
        if (-1 < (int)g) {
          if (this->m_limit < (int)g) break;
          for (mbr = 0; mbr < (int)uVar2; mbr = mbr + 1) {
            coords._8_4_ = this->m_pParams->m_pScan_deltas[mbr];
            coords.m_inten_table = this->m_br + coords._8_4_;
            if (-1 < (int)coords.m_inten_table) {
              if (this->m_limit < (int)coords.m_inten_table) break;
              etc1_solution_coordinates::etc1_solution_coordinates
                        ((etc1_solution_coordinates *)&refinement_trial,coords.m_inten_table,g,b,0,
                         (bool)(this->m_pParams->m_use_color4 & 1));
              if ((this->m_pParams->super_etc1_pack_params).m_quality == cHighQuality) {
                bVar8 = evaluate_solution(this,(etc1_solution_coordinates *)&refinement_trial,
                                          &this->m_trial_solution,&this->m_best_solution);
                if (bVar8) {
LAB_0020aeb0:
                  if ((this->m_pParams->super_etc1_pack_params).m_quality == cLowQuality) {
                    local_c4 = 2;
                  }
                  else {
                    local_c4 = 2;
                    if ((coords._8_4_ == 0 && iVar4 == 0) && iVar3 == 0) {
                      local_c4 = 4;
                    }
                  }
                  for (pSelectors_1._0_4_ = 0; (uint)pSelectors_1 < local_c4;
                      pSelectors_1._0_4_ = (uint)pSelectors_1 + 1) {
                    uVar5 = (this->m_best_solution).m_coords.m_inten_table;
                    delta_sum_b = 0;
                    base_color.field_0 =
                         (anon_union_4_3_dd316fa8_for_color_quad_u8_0)
                         (anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad_u8_0_0
                         )0x0;
                    r = 0;
                    etc1_solution_coordinates::get_scaled_color((etc1_solution_coordinates *)&s);
                    pInten_table = (int *)(this->m_best_solution).m_selectors;
                    for (yd_1 = 0; (uint)yd_1 < uVar1; yd_1 = yd_1 + 1) {
                      iVar7 = *(int *)(g_etc1_inten_tables +
                                      (ulong)(byte)*pInten_table * 4 + (ulong)uVar5 * 0x10);
                      iVar6 = clamp<int>((uint)(byte)s + iVar7,0,0xff);
                      delta_sum_b = (iVar6 - (uint)(byte)s) + delta_sum_b;
                      iVar6 = clamp<int>((uint)s._1_1_ + iVar7,0,0xff);
                      base_color.field_0 =
                           (anon_union_4_3_dd316fa8_for_color_quad_u8_0)
                           ((iVar6 - (uint)s._1_1_) + (int)base_color.field_0);
                      iVar7 = clamp<int>((uint)s._2_1_ + iVar7,0,0xff);
                      r = (iVar7 - (uint)s._2_1_) + r;
                      pInten_table = (int *)((long)pInten_table + 1);
                    }
                    if (((delta_sum_b == 0) && (base_color.field_0 == 0)) && (r == 0)) break;
                    fVar9 = (float)(int)base_color.field_0;
                    fVar10 = (float)(int)r;
                    this_00 = &this->m_avg_color;
                    fVar11 = vec3F::operator[](this_00,0);
                    r_00 = clamp<int>((int)(long)(((fVar11 - (float)delta_sum_b / (float)uVar1) *
                                                  (float)this->m_limit) / 255.0 + 0.5),0,
                                      this->m_limit);
                    fVar11 = vec3F::operator[](this_00,1);
                    g_00 = clamp<int>((int)(long)(((fVar11 - fVar9 / (float)uVar1) *
                                                  (float)this->m_limit) / 255.0 + 0.5),0,
                                      this->m_limit);
                    fVar9 = vec3F::operator[](this_00,2);
                    coords1._8_4_ =
                         clamp<int>((int)(long)(((fVar9 - fVar10 / (float)uVar1) *
                                                (float)this->m_limit) / 255.0 + 0.5),0,this->m_limit
                                   );
                    coords1.m_inten_table._3_1_ = '\0';
                    if (((coords.m_inten_table == r_00) && (g == g_00)) && (b == coords1._8_4_)) {
                      coords1.m_inten_table._3_1_ = '\x01';
                    }
                    else if (((r_00 == (this->m_best_solution).m_coords.m_unscaled_color.field_0.
                                       field_0.r) &&
                             (g_00 == (this->m_best_solution).m_coords.m_unscaled_color.field_0.
                                      field_0.g)) &&
                            (coords1._8_4_ ==
                             (uint)(this->m_best_solution).m_coords.m_unscaled_color.field_0.field_0
                                   .b)) {
                      coords1.m_inten_table._3_1_ = '\x01';
                    }
                    else if (((this->m_br == r_00) && (this->m_bg == g_00)) &&
                            (this->m_bb == coords1._8_4_)) {
                      coords1.m_inten_table._3_1_ = '\x01';
                    }
                    if (coords1.m_inten_table._3_1_ != '\0') break;
                    etc1_solution_coordinates::etc1_solution_coordinates
                              ((etc1_solution_coordinates *)((long)&pSelectors + 4),r_00,g_00,
                               coords1._8_4_,0,(bool)(this->m_pParams->m_use_color4 & 1));
                    if ((this->m_pParams->super_etc1_pack_params).m_quality == cHighQuality) {
                      bVar8 = evaluate_solution(this,(etc1_solution_coordinates *)
                                                     ((long)&pSelectors + 4),&this->m_trial_solution
                                                ,&this->m_best_solution);
                    }
                    else {
                      bVar8 = evaluate_solution_fast
                                        (this,(etc1_solution_coordinates *)((long)&pSelectors + 4),
                                         &this->m_trial_solution,&this->m_best_solution);
                    }
                    if (!bVar8) break;
                  }
                }
              }
              else {
                bVar8 = evaluate_solution_fast
                                  (this,(etc1_solution_coordinates *)&refinement_trial,
                                   &this->m_trial_solution,&this->m_best_solution);
                if (bVar8) goto LAB_0020aeb0;
              }
            }
          }
        }
      }
    }
  }
  bVar8 = ((this->m_best_solution).m_valid & 1U) != 0;
  if (bVar8) {
    this->m_pResult->m_error = (this->m_best_solution).m_error;
    color_quad_u8::operator=
              (&this->m_pResult->m_block_color_unscaled,(color_quad_u8 *)&this->m_best_solution);
    this->m_pResult->m_block_color4 = (bool)((this->m_best_solution).m_coords.m_color4 & 1);
    this->m_pResult->m_block_inten_table = (this->m_best_solution).m_coords.m_inten_table;
    memcpy(this->m_pResult->m_pSelectors,(this->m_best_solution).m_selectors,(ulong)uVar1);
    this->m_pResult->m_n = uVar1;
  }
  else {
    this->m_pResult->m_error = 0xffffffff;
  }
  return bVar8;
}

Assistant:

bool etc1_optimizer::compute()
        {
            const uint n = m_pParams->m_num_src_pixels;
            const int scan_delta_size = m_pParams->m_scan_delta_size;

            // Scan through a subset of the 3D lattice centered around the avg block color trying each 3D (555 or 444) lattice point as a potential block color.
            // Each time a better solution is found try to refine the current solution's block color based of the current selectors and intensity table index.
            for (int zdi = 0; zdi < scan_delta_size; zdi++)
            {
                const int zd = m_pParams->m_pScan_deltas[zdi];
                const int mbb = m_bb + zd;
                if (mbb < 0)
                {
                    continue;
                }
                else if (mbb > m_limit)
                {
                    break;
                }

                for (int ydi = 0; ydi < scan_delta_size; ydi++)
                {
                    const int yd = m_pParams->m_pScan_deltas[ydi];
                    const int mbg = m_bg + yd;
                    if (mbg < 0)
                    {
                        continue;
                    }
                    else if (mbg > m_limit)
                    {
                        break;
                    }

                    for (int xdi = 0; xdi < scan_delta_size; xdi++)
                    {
                        const int xd = m_pParams->m_pScan_deltas[xdi];
                        const int mbr = m_br + xd;
                        if (mbr < 0)
                        {
                            continue;
                        }
                        else if (mbr > m_limit)
                        {
                            break;
                        }

                        etc1_solution_coordinates coords(mbr, mbg, mbb, 0, m_pParams->m_use_color4);
                        if (m_pParams->m_quality == cHighQuality)
                        {
                            if (!evaluate_solution(coords, m_trial_solution, &m_best_solution))
                            {
                                continue;
                            }
                        }
                        else
                        {
                            if (!evaluate_solution_fast(coords, m_trial_solution, &m_best_solution))
                            {
                                continue;
                            }
                        }

                        // Now we have the input block, the avg. color of the input pixels, a set of trial selector indices, and the block color+intensity index.
                        // Now, for each component, attempt to refine the current solution by solving a simple linear equation. For example, for 4 colors:
                        // The goal is:
                        // pixel0 - (block_color+inten_table[selector0]) + pixel1 - (block_color+inten_table[selector1]) + pixel2 - (block_color+inten_table[selector2]) + pixel3 - (block_color+inten_table[selector3]) = 0
                        // Rearranging this:
                        // (pixel0 + pixel1 + pixel2 + pixel3) - (block_color+inten_table[selector0]) - (block_color+inten_table[selector1]) - (block_color+inten_table[selector2]) - (block_color+inten_table[selector3]) = 0
                        // (pixel0 + pixel1 + pixel2 + pixel3) - block_color - inten_table[selector0] - block_color-inten_table[selector1] - block_color-inten_table[selector2] - block_color-inten_table[selector3] = 0
                        // (pixel0 + pixel1 + pixel2 + pixel3) - 4*block_color - inten_table[selector0] - inten_table[selector1] - inten_table[selector2] - inten_table[selector3] = 0
                        // (pixel0 + pixel1 + pixel2 + pixel3) - 4*block_color - (inten_table[selector0] + inten_table[selector1] + inten_table[selector2] + inten_table[selector3]) = 0
                        // (pixel0 + pixel1 + pixel2 + pixel3)/4 - block_color - (inten_table[selector0] + inten_table[selector1] + inten_table[selector2] + inten_table[selector3])/4 = 0
                        // block_color = (pixel0 + pixel1 + pixel2 + pixel3)/4 - (inten_table[selector0] + inten_table[selector1] + inten_table[selector2] + inten_table[selector3])/4
                        // So what this means:
                        // optimal_block_color = avg_input - avg_inten_delta
                        // So the optimal block color can be computed by taking the average block color and subtracting the current average of the intensity delta.
                        // Unfortunately, optimal_block_color must then be quantized to 555 or 444 so it's not always possible to improve matters using this formula.
                        // Also, the above formula is for unclamped intensity deltas. The actual implementation takes into account clamping.

                        const uint max_refinement_trials = (m_pParams->m_quality == cLowQuality) ? 2 : (((xd | yd | zd) == 0) ? 4 : 2);
                        for (uint refinement_trial = 0; refinement_trial < max_refinement_trials; refinement_trial++)
                        {
                            const uint8* pSelectors = m_best_solution.m_selectors;
                            const int* pInten_table = g_etc1_inten_tables[m_best_solution.m_coords.m_inten_table];

                            int delta_sum_r = 0, delta_sum_g = 0, delta_sum_b = 0;
                            const color_quad_u8 base_color(m_best_solution.m_coords.get_scaled_color());
                            for (uint r = 0; r < n; r++)
                            {
                                const uint s = *pSelectors++;
                                const int yd = pInten_table[s];
                                // Compute actual delta being applied to each pixel, taking into account clamping.
                                delta_sum_r += rg_etc1::clamp<int>(base_color.r + yd, 0, 255) - base_color.r;
                                delta_sum_g += rg_etc1::clamp<int>(base_color.g + yd, 0, 255) - base_color.g;
                                delta_sum_b += rg_etc1::clamp<int>(base_color.b + yd, 0, 255) - base_color.b;
                            }
                            if ((!delta_sum_r) && (!delta_sum_g) && (!delta_sum_b))
                            {
                                break;
                            }
                            const float avg_delta_r_f = static_cast<float>(delta_sum_r) / n;
                            const float avg_delta_g_f = static_cast<float>(delta_sum_g) / n;
                            const float avg_delta_b_f = static_cast<float>(delta_sum_b) / n;
                            const int br1 = rg_etc1::clamp<int>(static_cast<uint>((m_avg_color[0] - avg_delta_r_f) * m_limit / 255.0f + .5f), 0, m_limit);
                            const int bg1 = rg_etc1::clamp<int>(static_cast<uint>((m_avg_color[1] - avg_delta_g_f) * m_limit / 255.0f + .5f), 0, m_limit);
                            const int bb1 = rg_etc1::clamp<int>(static_cast<uint>((m_avg_color[2] - avg_delta_b_f) * m_limit / 255.0f + .5f), 0, m_limit);

                            bool skip = false;

                            if ((mbr == br1) && (mbg == bg1) && (mbb == bb1))
                            {
                                skip = true;
                            }
                            else if ((br1 == m_best_solution.m_coords.m_unscaled_color.r) && (bg1 == m_best_solution.m_coords.m_unscaled_color.g) && (bb1 == m_best_solution.m_coords.m_unscaled_color.b))
                            {
                                skip = true;
                            }
                            else if ((m_br == br1) && (m_bg == bg1) && (m_bb == bb1))
                            {
                                skip = true;
                            }

                            if (skip)
                            {
                                break;
                            }

                            etc1_solution_coordinates coords1(br1, bg1, bb1, 0, m_pParams->m_use_color4);
                            if (m_pParams->m_quality == cHighQuality)
                            {
                                if (!evaluate_solution(coords1, m_trial_solution, &m_best_solution))
                                {
                                    break;
                                }
                            }
                            else
                            {
                                if (!evaluate_solution_fast(coords1, m_trial_solution, &m_best_solution))
                                {
                                    break;
                                }
                            }

                        } // refinement_trial

                    } // xdi
                } // ydi
            } // zdi

            if (!m_best_solution.m_valid)
            {
                m_pResult->m_error = cUINT32_MAX;
                return false;
            }

            const uint8* pSelectors = m_best_solution.m_selectors;

#ifdef RG_ETC1_BUILD_DEBUG
            {
                color_quad_u8 block_colors[4];
                m_best_solution.m_coords.get_block_colors(block_colors);

                const color_quad_u8* pSrc_pixels = m_pParams->m_pSrc_pixels;
                uint64 actual_error = 0;
                for (uint i = 0; i < n; i++)
                    actual_error += pSrc_pixels[i].squared_distance_rgb(block_colors[pSelectors[i]]);

                RG_ETC1_ASSERT(actual_error == m_best_solution.m_error);
            }
#endif

            m_pResult->m_error = m_best_solution.m_error;

            m_pResult->m_block_color_unscaled = m_best_solution.m_coords.m_unscaled_color;
            m_pResult->m_block_color4 = m_best_solution.m_coords.m_color4;

            m_pResult->m_block_inten_table = m_best_solution.m_coords.m_inten_table;
            memcpy(m_pResult->m_pSelectors, pSelectors, n);
            m_pResult->m_n = n;

            return true;
        }